

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32 tag)

{
  int iVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  uint8 *puVar5;
  int64 iVar6;
  uint first_byte_or_zero;
  pair<unsigned_long,_bool> pVar7;
  uint32 value_1;
  uint64 value;
  uint32 local_1c;
  uint64 local_18;
  
  if (tag < 8) goto LAB_002fc767;
  bVar4 = 0;
  switch(tag & 7) {
  case 0:
    puVar5 = input->buffer_;
    if ((input->buffer_end_ <= puVar5) || ((char)*puVar5 < '\0')) {
      pVar7 = io::CodedInputStream::ReadVarint64Fallback(input);
      bVar4 = pVar7.second;
      goto switchD_002fc791_caseD_4;
    }
    puVar5 = puVar5 + 1;
    break;
  case 1:
    if (*(int *)&input->buffer_end_ - (int)input->buffer_ < 8) {
      bVar4 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_18);
      goto switchD_002fc791_caseD_4;
    }
    puVar5 = input->buffer_ + 8;
    break;
  case 2:
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_002fc865;
      input->buffer_ = pbVar2 + 1;
      bVar3 = true;
    }
    else {
      first_byte_or_zero = 0;
LAB_002fc865:
      iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      first_byte_or_zero = (uint)iVar6;
      bVar3 = -1 < iVar6;
    }
    if (bVar3) {
      bVar3 = io::CodedInputStream::Skip(input,first_byte_or_zero);
      return bVar3;
    }
    goto LAB_002fc767;
  case 3:
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if ((0 < iVar1) && (bVar3 = SkipMessage(input), bVar3)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      bVar4 = input->last_tag_ == (tag & 0xfffffff8 | 4);
      goto switchD_002fc791_caseD_4;
    }
LAB_002fc767:
    bVar4 = 0;
  default:
    goto switchD_002fc791_caseD_4;
  case 5:
    if (*(int *)&input->buffer_end_ - (int)input->buffer_ < 4) {
      bVar4 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_1c);
      goto switchD_002fc791_caseD_4;
    }
    puVar5 = input->buffer_ + 4;
  }
  input->buffer_ = puVar5;
  bVar4 = 1;
switchD_002fc791_caseD_4:
  return (bool)(bVar4 & 1);
}

Assistant:

bool WireFormatLite::SkipField(
    io::CodedInputStream* input, uint32 tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(WireFormatLite::MakeTag(
          WireFormatLite::GetTagFieldNumber(tag),
          WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}